

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_sse4.c
# Opt level: O0

void filter_src_pixels(__m128i src,__m128i *tmp,__m128i *coeff,int offset_bits_horiz,
                      int reduce_bits_horiz,int k)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  short sVar5;
  ushort *puVar6;
  uint in_ECX;
  byte in_DL;
  undefined1 (*in_RSI) [16];
  long in_RDI;
  int in_R8D;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  __m128i res_46;
  __m128i src_46;
  __m128i res_02;
  __m128i src_02;
  __m128i src_odd;
  __m128i src_even;
  undefined8 local_288;
  undefined8 local_278;
  byte local_260;
  undefined8 local_1c8;
  undefined8 local_1a8;
  undefined8 local_188;
  undefined8 local_178;
  __m128i res;
  __m128i res_odd;
  __m128i res_even;
  __m128i round_const;
  __m128i res_57;
  __m128i src_57;
  __m128i res_13;
  __m128i src_13;
  
  auVar10._8_8_ = in_XMM0_Qb;
  auVar10._0_8_ = in_XMM0_Qa;
  auVar7[8] = '\b';
  auVar7[9] = '\n';
  auVar7[10] = '\n';
  auVar7[0xb] = '\f';
  auVar7[0xc] = '\f';
  auVar7[0xd] = '\x0e';
  auVar7[0xe] = '\x0e';
  auVar7[0xf] = '\0';
  auVar7[0] = '\0';
  auVar7[1] = '\x02';
  auVar7[2] = '\x02';
  auVar7[3] = '\x04';
  auVar7[4] = '\x04';
  auVar7[5] = '\x06';
  auVar7[6] = '\x06';
  auVar7[7] = '\b';
  auVar7 = pshufb(auVar10,auVar7);
  auVar9._8_8_ = in_XMM0_Qb;
  auVar9._0_8_ = in_XMM0_Qa;
  auVar8[8] = '\t';
  auVar8[9] = '\v';
  auVar8[10] = '\v';
  auVar8[0xb] = '\r';
  auVar8[0xc] = '\r';
  auVar8[0xd] = '\x0f';
  auVar8[0xe] = '\x0f';
  auVar8[0xf] = '\0';
  auVar8[0] = '\x01';
  auVar8[1] = '\x03';
  auVar8[2] = '\x03';
  auVar8[3] = '\x05';
  auVar8[4] = '\x05';
  auVar8[5] = '\a';
  auVar8[6] = '\a';
  auVar8[7] = '\t';
  auVar8 = pshufb(auVar9,auVar8);
  local_278 = auVar7._0_8_;
  local_288 = auVar8._0_8_;
  auVar4._8_8_ = local_288;
  auVar4._0_8_ = local_278;
  auVar9 = pmaddubsw(auVar4,*in_RSI);
  local_178 = auVar7._4_8_;
  local_188 = auVar8._4_8_;
  auVar3._8_8_ = local_188;
  auVar3._0_8_ = local_178;
  auVar8 = pmaddubsw(auVar3,in_RSI[1]);
  local_1a8 = auVar7._2_8_;
  auVar2._8_8_ = local_1a8;
  auVar2._0_8_ = local_288;
  auVar10 = pmaddubsw(auVar2,in_RSI[2]);
  local_1c8 = auVar7._6_8_;
  auVar1._8_8_ = local_1c8;
  auVar1._0_8_ = local_188;
  auVar7 = pmaddubsw(auVar1,in_RSI[3]);
  local_260 = (byte)in_ECX;
  sVar5 = (short)(1 << (in_DL & 0x1f)) + (short)((uint)(1 << (local_260 & 0x1f)) >> 1);
  round_const[1]._0_2_ = auVar9._0_2_;
  round_const[1]._2_2_ = auVar9._2_2_;
  round_const[1]._4_2_ = auVar9._4_2_;
  round_const[1]._6_2_ = auVar9._6_2_;
  res_57[0]._0_2_ = auVar9._8_2_;
  res_57[0]._2_2_ = auVar9._10_2_;
  res_57[0]._4_2_ = auVar9._12_2_;
  res_57[0]._6_2_ = auVar9._14_2_;
  res_even[1]._0_2_ = auVar8._0_2_;
  res_even[1]._2_2_ = auVar8._2_2_;
  res_even[1]._4_2_ = auVar8._4_2_;
  res_even[1]._6_2_ = auVar8._6_2_;
  round_const[0]._0_2_ = auVar8._8_2_;
  round_const[0]._2_2_ = auVar8._10_2_;
  round_const[0]._4_2_ = auVar8._12_2_;
  round_const[0]._6_2_ = auVar8._14_2_;
  res_odd[1]._0_2_ = auVar10._0_2_;
  res_odd[1]._2_2_ = auVar10._2_2_;
  res_odd[1]._4_2_ = auVar10._4_2_;
  res_odd[1]._6_2_ = auVar10._6_2_;
  res_even[0]._0_2_ = auVar10._8_2_;
  res_even[0]._2_2_ = auVar10._10_2_;
  res_even[0]._4_2_ = auVar10._12_2_;
  res_even[0]._6_2_ = auVar10._14_2_;
  res[1]._0_2_ = auVar7._0_2_;
  res[1]._2_2_ = auVar7._2_2_;
  res[1]._4_2_ = auVar7._4_2_;
  res[1]._6_2_ = auVar7._6_2_;
  res_odd[0]._0_2_ = auVar7._8_2_;
  res_odd[0]._2_2_ = auVar7._10_2_;
  res_odd[0]._4_2_ = auVar7._12_2_;
  res_odd[0]._6_2_ = auVar7._14_2_;
  res_13[1] = (longlong)in_ECX;
  puVar6 = (ushort *)(in_RDI + (long)(in_R8D + 7) * 0x10);
  *puVar6 = (ushort)((short)round_const[1] + (short)res_even[1] + (short)res_odd[1] + (short)res[1]
                    + sVar5) >> res_13[1];
  puVar6[1] = (ushort)(round_const[1]._2_2_ + res_even[1]._2_2_ + res_odd[1]._2_2_ + res[1]._2_2_ +
                      sVar5) >> res_13[1];
  puVar6[2] = (ushort)(round_const[1]._4_2_ + res_even[1]._4_2_ + res_odd[1]._4_2_ + res[1]._4_2_ +
                      sVar5) >> res_13[1];
  puVar6[3] = (ushort)(round_const[1]._6_2_ + res_even[1]._6_2_ + res_odd[1]._6_2_ + res[1]._6_2_ +
                      sVar5) >> res_13[1];
  puVar6[4] = (ushort)((short)res_57[0] + (short)round_const[0] +
                       (short)res_even[0] + (short)res_odd[0] + sVar5) >> res_13[1];
  puVar6[5] = (ushort)(res_57[0]._2_2_ + round_const[0]._2_2_ + res_even[0]._2_2_ + res_odd[0]._2_2_
                      + sVar5) >> res_13[1];
  puVar6[6] = (ushort)(res_57[0]._4_2_ + round_const[0]._4_2_ + res_even[0]._4_2_ + res_odd[0]._4_2_
                      + sVar5) >> res_13[1];
  puVar6[7] = (ushort)(res_57[0]._6_2_ + round_const[0]._6_2_ + res_even[0]._6_2_ + res_odd[0]._6_2_
                      + sVar5) >> res_13[1];
  return;
}

Assistant:

static inline void filter_src_pixels(__m128i src, __m128i *tmp, __m128i *coeff,
                                     const int offset_bits_horiz,
                                     const int reduce_bits_horiz, int k) {
  const __m128i src_even =
      _mm_shuffle_epi8(src, _mm_load_si128((__m128i *)even_mask));
  const __m128i src_odd =
      _mm_shuffle_epi8(src, _mm_load_si128((__m128i *)odd_mask));
  // The pixel order we need for 'src' is:
  // 0 2 2 4 4 6 6 8 1 3 3 5 5 7 7 9
  const __m128i src_02 = _mm_unpacklo_epi64(src_even, src_odd);
  const __m128i res_02 = _mm_maddubs_epi16(src_02, coeff[0]);
  // 4 6 6 8 8 10 10 12 5 7 7 9 9 11 11 13
  const __m128i src_46 = _mm_unpacklo_epi64(_mm_srli_si128(src_even, 4),
                                            _mm_srli_si128(src_odd, 4));
  const __m128i res_46 = _mm_maddubs_epi16(src_46, coeff[1]);
  // 1 3 3 5 5 7 7 9 2 4 4 6 6 8 8 10
  const __m128i src_13 =
      _mm_unpacklo_epi64(src_odd, _mm_srli_si128(src_even, 2));
  const __m128i res_13 = _mm_maddubs_epi16(src_13, coeff[2]);
  // 5 7 7 9 9 11 11 13 6 8 8 10 10 12 12 14
  const __m128i src_57 = _mm_unpacklo_epi64(_mm_srli_si128(src_odd, 4),
                                            _mm_srli_si128(src_even, 6));
  const __m128i res_57 = _mm_maddubs_epi16(src_57, coeff[3]);

  const __m128i round_const = _mm_set1_epi16((1 << offset_bits_horiz) +
                                             ((1 << reduce_bits_horiz) >> 1));

  // Note: The values res_02 + res_46 and res_13 + res_57 both
  // fit into int16s at this point, but their sum may be too wide to fit
  // into an int16. However, once we also add round_const, the sum of
  // all of these fits into a uint16.
  //
  // The wrapping behaviour of _mm_add_* is used here to make sure we
  // get the correct result despite converting between different
  // (implicit) types.
  const __m128i res_even = _mm_add_epi16(res_02, res_46);
  const __m128i res_odd = _mm_add_epi16(res_13, res_57);
  const __m128i res =
      _mm_add_epi16(_mm_add_epi16(res_even, res_odd), round_const);
  tmp[k + 7] = _mm_srl_epi16(res, _mm_cvtsi32_si128(reduce_bits_horiz));
}